

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmExecutionStatus *pcVar1;
  cmFileCopier *this_00;
  bool bVar2;
  bool bVar3;
  mode_t permissions_00;
  int iVar4;
  ostream *poVar5;
  unsigned_long uVar6;
  char *pcVar7;
  mode_t permissions_01;
  unsigned_long dindex;
  char local_219;
  cmFileCopier *local_218;
  Directory dir;
  mode_t permissions;
  unsigned_long local_200;
  char *local_1f8;
  string toPath;
  Status makedir_status;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  ostringstream e;
  
  local_218 = this;
  bVar2 = cmsys::SystemTools::FileIsDirectory(destination);
  bVar3 = true;
  if (bVar2) {
    bVar3 = cmsys::SystemTools::FileIsSymlink(destination);
  }
  this_00 = local_218;
  (*local_218->_vptr_cmFileCopier[5])(local_218,destination,1,(ulong)bVar3);
  default_dir_mode = &default_dir_mode_v;
  default_dir_mode_v = 0;
  bVar2 = GetDefaultDirectoryPermissions(this_00,&default_dir_mode);
  if (bVar2) {
    makedir_status = cmsys::SystemTools::MakeDirectory(destination,default_dir_mode);
    if (makedir_status.Kind_ == Success) {
      permissions = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        permissions = local_218->DirPermissions;
      }
      if (permissions == 0) {
        cmsys::SystemTools::GetPermissions(source,&permissions);
      }
      permissions_01 = permissions | 0x1c0;
      permissions_00 = permissions;
      if ((~permissions & 0x1c0) == 0) {
        permissions_00 = 0;
        permissions_01 = permissions;
      }
      bVar2 = SetPermissions(local_218,destination,permissions_01);
      if (bVar2) {
        cmsys::Directory::Directory(&dir);
        if (source->_M_string_length != 0) {
          cmsys::Directory::Load(&dir,source,(string *)0x0);
        }
        uVar6 = cmsys::Directory::GetNumberOfFiles(&dir);
        dindex = 0;
        do {
          if (uVar6 == dindex) {
            bVar2 = SetPermissions(local_218,destination,permissions_00);
LAB_0045d197:
            cmsys::Directory::~Directory(&dir);
            return bVar2;
          }
          pcVar7 = cmsys::Directory::GetFile(&dir,dindex);
          if (((*pcVar7 != '.') || (pcVar7[1] != '\0')) &&
             ((pcVar7 = cmsys::Directory::GetFile(&dir,dindex), *pcVar7 != '.' ||
              ((pcVar7[1] != '.' || (pcVar7[2] != '\0')))))) {
            local_1f8 = (char *)CONCAT71(local_1f8._1_7_,0x2f);
            local_200 = dindex;
            toPath._M_dataplus._M_p = cmsys::Directory::GetFile(&dir,dindex);
            cmStrCat<std::__cxx11::string_const&,char,char_const*>
                      ((string *)&e,source,(char *)&local_1f8,(char **)&toPath);
            local_219 = '/';
            local_1f8 = cmsys::Directory::GetFile(&dir,local_200);
            cmStrCat<std::__cxx11::string_const&,char,char_const*>
                      (&toPath,destination,&local_219,&local_1f8);
            iVar4 = (*local_218->_vptr_cmFileCopier[3])(local_218,(string *)&e,&toPath);
            std::__cxx11::string::~string((string *)&toPath);
            std::__cxx11::string::~string((string *)&e);
            dindex = local_200;
            if ((char)iVar4 == '\0') {
              bVar2 = false;
              goto LAB_0045d197;
            }
          }
          dindex = dindex + 1;
        } while( true );
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,local_218->Name);
      poVar5 = std::operator<<(poVar5," cannot make directory \"");
      poVar5 = std::operator<<(poVar5,(string *)destination);
      poVar5 = std::operator<<(poVar5,"\": ");
      cmsys::Status::GetString_abi_cxx11_(&toPath,&makedir_status);
      poVar5 = std::operator<<(poVar5,(string *)&toPath);
      std::operator<<(poVar5,".");
      std::__cxx11::string::~string((string *)&toPath);
      pcVar1 = local_218->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      std::__cxx11::string::~string((string *)&toPath);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  auto makedir_status =
    cmSystemTools::MakeDirectory(destination, default_dir_mode);
  if (!makedir_status) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << makedir_status.GetString() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}